

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

void __thiscall net_uv::KCPSocket::~KCPSocket(KCPSocket *this)

{
  KCPSocket *this_local;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__KCPSocket_002032d8;
  if (this->m_socketAddr != (sockaddr *)0x0) {
    free(this->m_socketAddr);
    this->m_socketAddr = (sockaddr *)0x0;
  }
  if (this->m_recvBuf != (char *)0x0) {
    free(this->m_recvBuf);
    this->m_recvBuf = (char *)0x0;
  }
  if (this->m_udp == (uv_udp_t *)0x0) {
    if ((this->m_socketMng != (KCPSocketManager *)0x0) && ((this->m_weakRefTag & 1U) == 0)) {
      (**this->m_socketMng->_vptr_KCPSocketManager)();
      free(this->m_socketMng);
      this->m_socketMng = (KCPSocketManager *)0x0;
    }
    std::function<bool_(const_sockaddr_*)>::~function(&this->m_connectFilterCall);
    std::function<void_(net_uv::Socket_*)>::~function(&this->m_newConnectionCall);
    Socket::~Socket(&this->super_Socket);
    return;
  }
  __assert_fail("m_udp == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/KCPSocket.cpp"
                ,0x21,"virtual net_uv::KCPSocket::~KCPSocket()");
}

Assistant:

KCPSocket::~KCPSocket()
{
	FC_SAFE_FREE(m_socketAddr);
	FC_SAFE_FREE(m_recvBuf);

	assert(m_udp == NULL);

	if (m_socketMng != NULL && !m_weakRefTag)
	{
		m_socketMng->~KCPSocketManager();
		fc_free(m_socketMng);
		m_socketMng = NULL;
	}
}